

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoProcessing.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uchar *puVar2;
  uchar **in_R8;
  _InputArray local_368;
  allocator local_349;
  string local_348 [32];
  char local_328 [8];
  char finalWinName [14];
  Mat fullImageMat;
  _OutputArray local_2b8;
  _InputArray local_2a0;
  Size_<int> local_288;
  _OutputArray local_280;
  _InputArray local_268;
  Mat local_250 [96];
  Mat local_1f0 [96];
  _InputArray local_190;
  _InputArray local_178;
  Mat local_150 [8];
  Mat frame;
  VideoCapture local_f0 [8];
  VideoCapture cap;
  MPI_Status *statuses;
  MPI_Request *requests;
  MPI_Status status;
  char imageFile [20];
  int local_7c [2];
  int rank;
  int bufferInt [20];
  int local_1c;
  int j;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _j = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&j);
  MPI_Comm_rank(&ompi_mpi_comm_world,local_7c);
  MPI_Comm_size(&ompi_mpi_comm_world,&numberProcesses);
  WIDTH = 0x280;
  HEIGHT = 0x1e0;
  stripSize = 0x1e0 / numberProcesses;
  stripImage = (uchar *)malloc((long)(stripSize * 0x280));
  stripMatrix = (uchar **)malloc((long)stripSize << 3);
  for (local_1c = 0; local_1c < stripSize; local_1c = local_1c + 1) {
    puVar2 = (uchar *)malloc((long)WIDTH);
    stripMatrix[local_1c] = puVar2;
  }
  fullImage = (uchar *)malloc((long)(WIDTH * HEIGHT));
  do {
    iVar1 = (int)in_R8;
    if (local_7c[0] == 0) {
      cv::VideoCapture::VideoCapture(local_f0,0,0);
      cv::Mat::Mat(local_150);
      cv::VideoCapture::operator>>(local_f0,local_150);
      cv::_InputArray::_InputArray(&local_178,local_150);
      cv::_OutputArray::_OutputArray((_OutputArray *)&local_190,local_150);
      cv::cvtColor((cv *)&local_178,&local_190,(_OutputArray *)0x6,0,iVar1);
      cv::_OutputArray::~_OutputArray((_OutputArray *)&local_190);
      cv::_InputArray::~_InputArray(&local_178);
      cv::Mat::Mat(local_1f0,local_150);
      readImage(local_1f0);
      cv::Mat::~Mat(local_1f0);
      cv::Mat::~Mat(local_150);
      cv::VideoCapture::~VideoCapture(local_f0);
    }
    MPI_Bcast(&WIDTH);
    MPI_Bcast(&HEIGHT,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    MPI_Bcast(&MAX_COLOR,1,&ompi_mpi_int,0,&ompi_mpi_comm_world);
    horizontalStrips(local_7c[0]);
    sendStripstoAllProcesses(local_7c[0]);
    in_R8 = stripMatrix;
    cv::Mat::Mat(local_250,stripSize,WIDTH,0,stripMatrix,0);
    cv::Mat::operator=((Mat *)stripImageMat,local_250);
    cv::Mat::~Mat(local_250);
    stripImageMat._16_8_ = tempBuffer;
    MPI_Barrier(&ompi_mpi_comm_world);
    cv::_InputArray::_InputArray(&local_268,(Mat *)stripImageMat);
    cv::_OutputArray::_OutputArray(&local_280,(Mat *)stripImageMat);
    cv::Size_<int>::Size_(&local_288,7,7);
    cv::GaussianBlur(0,&local_268,&local_280,&local_288);
    cv::_OutputArray::~_OutputArray(&local_280);
    cv::_InputArray::~_InputArray(&local_268);
    cv::_InputArray::_InputArray(&local_2a0,(Mat *)stripImageMat);
    cv::_OutputArray::_OutputArray(&local_2b8,(Mat *)stripImageMat);
    cv::Canny(&local_2a0,&local_2b8,0.0,30.0,3,false);
    cv::_OutputArray::~_OutputArray(&local_2b8);
    cv::_InputArray::~_InputArray(&local_2a0);
    stichImages();
    if (local_7c[0] == 0) {
      in_R8 = (uchar **)fullImage;
      cv::Mat::Mat((Mat *)(finalWinName + 8),HEIGHT,WIDTH,0,fullImage,0);
      builtin_strncpy(finalWinName,"ndow ",6);
      builtin_strncpy(local_328,"Final wi",8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_348,local_328,&local_349);
      cv::_InputArray::_InputArray(&local_368,(Mat *)(finalWinName + 8));
      cv::imshow(local_348,&local_368);
      cv::_InputArray::~_InputArray(&local_368);
      std::__cxx11::string::~string(local_348);
      std::allocator<char>::~allocator((allocator<char> *)&local_349);
      cv::Mat::~Mat((Mat *)(finalWinName + 8));
    }
    iVar1 = cv::waitKey(1);
  } while (iVar1 != 0x1b);
  cleanUp();
  MPI_Finalize();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    int i, j, bufferInt[20], rank;
    char imageFile[20];

    MPI_Status status;
    MPI_Request *requests;
    MPI_Status *statuses;
    MPI_Init(&argc, &argv);
    MPI_Comm_rank(MPI_COMM_WORLD, &rank);
    MPI_Comm_size(MPI_COMM_WORLD, &numberProcesses);
    WIDTH=640;
    HEIGHT=480;
    stripSize=HEIGHT/numberProcesses;
    stripImage = (unsigned char *) malloc(WIDTH * stripSize * sizeof(unsigned char));
    stripMatrix = (unsigned char **) malloc(stripSize * sizeof(unsigned char *));
    for (i = 0; i < stripSize; i++) {
        stripMatrix[i] = (unsigned char *) malloc(WIDTH * sizeof(unsigned char));
    }
    fullImage = (unsigned char *) malloc(WIDTH * HEIGHT * sizeof(unsigned char));
    while (1) {
        if (rank == 0) {
            VideoCapture cap(0);
            Mat frame;
            cap >> frame; // get a new frame from camera
            cvtColor(frame, frame, COLOR_BGR2GRAY);
            //readImage("../res/images.jpg");
            readImage(frame);
            //Start Communication
            //cout<<"Communication started";
        }

        MPI_Bcast(&WIDTH, 1, MPI_INT, 0, MPI_COMM_WORLD);
        MPI_Bcast(&HEIGHT, 1, MPI_INT, 0, MPI_COMM_WORLD);
        MPI_Bcast(&MAX_COLOR, 1, MPI_INT, 0, MPI_COMM_WORLD);

        horizontalStrips(rank);
        //printf("\n[Process %d] Image Width: %d X %d => strip size: %d (%d..%d)\n", rank, WIDTH, HEIGHT, stripSize, stripStart, stripEnd);


        sendStripstoAllProcesses(rank);
        stripImageMat = Mat(stripSize, WIDTH, CV_8U, stripMatrix);
        stripImageMat.data = tempBuffer;
        //stripImageMat = stripImageMat(Rect(0, 0, WIDTH, stripSize));
        /*char winName[] = "window at rank ";
        winName[15] = rank + '0';
        winName[16] = '\0';
        imshow(winName, stripImageMat);*/
        //waitKey(0);


        //writeIntermediatoryImage();
        MPI_Barrier(MPI_COMM_WORLD);
        //TODO: Do whatever you wnant to. The intermediatory images are generated in "/res/it". Apply any filter or operation you want.
        GaussianBlur(stripImageMat, stripImageMat, Size(7, 7), 1.5, 1.5);
        Canny(stripImageMat, stripImageMat, 0, 30, 3);
        stichImages();
        if (rank == 0) {
            //writeStichedImage("../res/final.pgm");
            Mat fullImageMat = Mat(HEIGHT, WIDTH, CV_8U, fullImage);
            //stripImageMat.data = fullImage;
            //stripImageMat = stripImageMat(Rect(0, 0, WIDTH, stripSize));
            char finalWinName[] = "Final window ";
            imshow(finalWinName, fullImageMat);
        }
        if (waitKey(1) == 27) break;
    }
    cleanUp();
    MPI_Finalize();

    return 0;
}